

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>::templated_iterator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
::emplace_new_key<std::pair<slang::DiagCode,std::__cxx11::string>>
          (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  DiagCode DVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  undefined8 uVar6;
  EntryPointer psVar7;
  EntryPointer psVar8;
  EntryPointer psVar9;
  long lVar10;
  long lVar11;
  undefined8 unaff_RBP;
  ulong uVar12;
  char __tmp_1;
  sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
  sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>::templated_iterator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  value_type to_insert;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 *local_38;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
       )distance_from_desired)) {
    lVar11 = *(long *)(this + 0x18) + 1;
    auVar14._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar14._0_8_ = lVar11;
    auVar14._12_4_ = 0x45300000;
    lVar10 = *(long *)(this + 8) + 1;
    auVar15._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar15._0_8_ = lVar10;
    auVar15._12_4_ = 0x45300000;
    if ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar15._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0))) {
      paVar1 = &(key->second).field_2;
      if (current_entry->distance_from_desired < '\0') {
        (current_entry->field_1).value.first = key->first;
        paVar4 = &(current_entry->field_1).value.second.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&current_entry->field_1 + 8) = paVar4;
        pcVar5 = (key->second)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 == paVar1) {
          uVar6 = *(undefined8 *)((long)&(key->second).field_2 + 8);
          paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&(current_entry->field_1).value.second.field_2 + 8) = uVar6;
        }
        else {
          (current_entry->field_1).value.second._M_dataplus._M_p = pcVar5;
          (current_entry->field_1).value.second.field_2._M_allocated_capacity =
               paVar1->_M_allocated_capacity;
        }
        (current_entry->field_1).value.second._M_string_length = (key->second)._M_string_length;
        (key->second)._M_dataplus._M_p = (pointer)paVar1;
        (key->second)._M_string_length = 0;
        (key->second).field_2._M_local_buf[0] = '\0';
        current_entry->distance_from_desired = distance_from_desired;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar12 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      }
      else {
        DVar3 = key->first;
        local_58._M_p = (pointer)&local_48;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(key->second)._M_dataplus._M_p;
        if (paVar4 == paVar1) {
          local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_48._8_8_ = *(undefined8 *)((long)&(key->second).field_2 + 8);
        }
        else {
          local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_58._M_p = (pointer)paVar4;
        }
        local_50 = (key->second)._M_string_length;
        (key->second)._M_dataplus._M_p = (pointer)paVar1;
        (key->second)._M_string_length = 0;
        (key->second).field_2._M_local_buf[0] = '\0';
        cVar2 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        local_60._0_4_ = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = DVar3;
        local_38 = (undefined1 *)((long)&current_entry->field_1 + 8);
        std::__cxx11::string::swap((string *)&local_58);
        sVar13 = (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
                  )(cVar2 + '\x01');
        cVar2 = current_entry[1].distance_from_desired;
        psVar9 = current_entry + 1;
        psVar8 = current_entry;
        DVar3 = (DiagCode)local_60._0_4_;
        while (psVar7 = psVar9, local_60._0_4_ = DVar3, -1 < cVar2) {
          if (cVar2 < (char)sVar13) {
            psVar7->distance_from_desired = (int8_t)sVar13;
            local_60._0_4_ = (psVar7->field_1).value.first;
            (psVar7->field_1).value.first = DVar3;
            std::__cxx11::string::swap((string *)&local_58);
            sVar13 = (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
                      )(cVar2 + '\x01');
          }
          else {
            sVar13 = (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
                      )((char)sVar13 + '\x01');
            if (sVar13 == this[0x11]) {
              local_60._0_4_ = (current_entry->field_1).value.first;
              (current_entry->field_1).value.first = DVar3;
              std::__cxx11::string::swap((string *)&local_58);
              sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::grow((sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)this);
              pVar16 = emplace<std::pair<slang::DiagCode,std::__cxx11::string>>
                                 (this,(pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_60);
              current_entry = (EntryPointer)pVar16.first.current;
              uVar12 = (ulong)pVar16._8_4_;
              goto LAB_0015813e;
            }
          }
          psVar9 = psVar7 + 1;
          psVar8 = psVar7;
          DVar3 = (DiagCode)local_60._0_4_;
          cVar2 = psVar7[1].distance_from_desired;
        }
        psVar8[1].field_1.value.first = DVar3;
        paVar1 = &psVar8[1].field_1.value.second.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&psVar8[1].field_1 + 8) = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p == &local_48) {
          paVar1->_M_allocated_capacity = local_48._M_allocated_capacity;
          *(undefined8 *)((long)&psVar8[1].field_1.value.second.field_2 + 8) = local_48._8_8_;
        }
        else {
          psVar8[1].field_1.value.second._M_dataplus._M_p = local_58._M_p;
          psVar8[1].field_1.value.second.field_2._M_allocated_capacity =
               local_48._M_allocated_capacity;
        }
        psVar8[1].field_1.value.second._M_string_length = local_50;
        local_50 = 0;
        local_48._M_allocated_capacity = local_48._M_allocated_capacity & 0xffffffffffffff00;
        psVar7->distance_from_desired = (int8_t)sVar13;
        *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
        uVar12 = CONCAT71((int7)((ulong)psVar7 >> 8),1);
        local_58._M_p = (pointer)&local_48;
LAB_0015813e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p != &local_48) {
          operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
        }
      }
      goto LAB_00157f5a;
    }
  }
  sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)this);
  pVar16 = emplace<std::pair<slang::DiagCode,std::__cxx11::string>>(this,key);
  current_entry = (EntryPointer)pVar16.first.current;
  uVar12 = (ulong)pVar16._8_4_;
LAB_00157f5a:
  pVar16._8_8_ = uVar12 & 0xffffffff;
  pVar16.first.current = current_entry;
  return pVar16;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }